

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

int qc_tcp_recvall(QcSocket *socket,char *recvbuf,int len)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  
  uVar3 = 0;
  iVar1 = len;
  while( true ) {
    sVar2 = recv(socket->sockfd,recvbuf + uVar3,(long)iVar1,0x4000);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0xfb,"tcp recv(in recvall) failed");
      return -1;
    }
    if (iVar1 == 0) break;
    uVar3 = uVar3 + iVar1;
    iVar1 = len - uVar3;
    if (iVar1 == 0 || len < (int)uVar3) {
      return len;
    }
  }
  return 0;
}

Assistant:

int qc_tcp_recvall(QcSocket *socket, char *recvbuf, int len)
{
    int bytes, rcved=0, torcv=0;

    torcv = len;
    while(1)
    {
        bytes = (int)recv(socket->sockfd, recvbuf+rcved, torcv, MSG_NOSIGNAL);
        if(bytes < 0)
        {
            qc_error("tcp recv(in recvall) failed");
            return -1;
        }
        else if(0 == bytes)
            return 0;  /*Connection closed*/

        rcved += bytes;
        if(rcved < len)
        {
            torcv = len - rcved;
            continue;
        }
        else
            return len;
    }
}